

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraints_with_arguments.cpp
# Opt level: O3

Am_Value from_owner_procedure(Am_Object *self)

{
  long *plVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  Am_Value *in_value;
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  Am_Slot_Key in_SI;
  Am_Value AVar5;
  Am_Object owner;
  Am_Object AStack_18;
  long *plVar4;
  
  *(undefined2 *)&self->data = 0;
  self[1].data = (Am_Object_Data *)0x0;
  Am_Object::Get_Object(&AStack_18,in_SI,10);
  bVar2 = Am_Object::Valid(&AStack_18);
  if (bVar2) {
    iVar3 = (*Am_Object::cc->_vptr_Am_Constraint_Context[6])();
    plVar4 = (long *)CONCAT44(extraout_var,iVar3);
    in_value = Am_Object::Get(&AStack_18,*(Am_Slot_Key *)((long)plVar4 + 0xc),0);
    Am_Value::operator=((Am_Value *)self,in_value);
    plVar1 = plVar4 + 1;
    *(int *)plVar1 = (int)*plVar1 + -1;
    if ((int)*plVar1 == 0) {
      (**(code **)(*plVar4 + 0x20))(plVar4);
    }
  }
  else {
    Am_Value::Set_Value_Type((Am_Value *)self,1);
  }
  Am_Object::~Am_Object(&AStack_18);
  AVar5.value.wrapper_value = extraout_RDX.wrapper_value;
  AVar5._0_8_ = self;
  return AVar5;
}

Assistant:

static Am_Value
from_owner_procedure(Am_Object &self)
{
  Am_Value value;
  Am_Object owner = self.Get_Owner();
  if (owner.Valid()) {
    Key_Store_Data *store =
        (Key_Store_Data *)Am_Object_Advanced::Get_Context()->Get_Data();
    value = owner.Get(store->key);
    store->Release();
  } else
    value.Set_Value_Type(Am_ZERO); //not there, return a ZERO type
  return value;
}